

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool ra_range_uint32_array(roaring_array_t *ra,size_t offset,size_t limit,uint32_t *ans)

{
  ulong uVar1;
  uint8_t uVar2;
  int iVar3;
  run_container_t *run;
  void *__dest;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint8_t *puVar7;
  bool bVar8;
  ulong uVar9;
  void *local_80;
  ulong local_70;
  long local_68;
  
  lVar5 = 0;
  uVar9 = 0;
  lVar4 = 0;
  bVar8 = false;
  local_68 = 0;
  local_80 = (void *)0x0;
  local_70 = 0;
  uVar6 = 0;
  do {
    if (ra->size <= lVar5) break;
    run = (run_container_t *)container_unwrap_shared(ra->containers[lVar5],ra->typecodes + lVar5);
    puVar7 = ra->typecodes;
    uVar2 = puVar7[lVar5];
    if (uVar2 == '\x03') {
      iVar3 = run_container_cardinality(run);
      lVar4 = (long)iVar3;
    }
    else if ((uVar2 == '\x02') || (uVar2 == '\x01')) {
      lVar4 = (long)run->n_runs;
    }
    uVar1 = uVar9;
    if (uVar6 < limit + offset && offset <= (lVar4 + uVar6) - 1) {
      if (!bVar8) {
        local_68 = offset - uVar6;
        local_70 = local_68 + limit;
        local_80 = calloc(1,local_70 * 4);
        if (local_80 == (void *)0x0) {
          return false;
        }
      }
      uVar1 = lVar4 + uVar9;
      if (local_70 < uVar1) {
        local_70 = local_70 + lVar4;
        __dest = calloc(1,local_70 * 4);
        if (__dest == (void *)0x0) {
          free(local_80);
          return false;
        }
        memcpy(__dest,local_80,uVar9 * 4);
        free(local_80);
        puVar7 = ra->typecodes;
        local_80 = __dest;
      }
      bVar8 = true;
      if ((byte)(puVar7[lVar5] - 1) < 3) {
        container_to_uint32_array
                  ((uint32_t *)((long)local_80 + uVar9 * 4),run,puVar7[lVar5],
                   (uint)ra->keys[lVar5] << 0x10);
      }
    }
    uVar9 = uVar1;
    uVar6 = uVar6 + lVar4;
    lVar5 = lVar5 + 1;
  } while (uVar9 - local_68 < limit);
  if (local_80 != (void *)0x0) {
    memcpy(ans,(void *)((long)local_80 + local_68 * 4),limit << 2);
    free(local_80);
  }
  return true;
}

Assistant:

bool ra_range_uint32_array(const roaring_array_t *ra, size_t offset, size_t limit, uint32_t *ans) {
    size_t ctr = 0;
    size_t dtr = 0;

    size_t t_limit = 0;

    bool first = false;
    size_t first_skip = 0;

    uint32_t *t_ans = NULL;
    size_t cur_len = 0;

    for (int i = 0; i < ra->size; ++i) {

        const container_t *c = container_unwrap_shared(
                                        ra->containers[i], &ra->typecodes[i]);
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                t_limit = (const_CAST_bitset(c))->cardinality;
                break;
            case ARRAY_CONTAINER_TYPE:
                t_limit = (const_CAST_array(c))->cardinality;
                break;
            case RUN_CONTAINER_TYPE:
                t_limit = run_container_cardinality(const_CAST_run(c));
                break;
        }
        if (ctr + t_limit - 1 >= offset && ctr < offset + limit){
            if (!first){
                //first_skip = t_limit - (ctr + t_limit - offset);
                first_skip = offset - ctr;
                first = true;
                t_ans = (uint32_t *)malloc(sizeof(*t_ans) * (first_skip + limit));
                if(t_ans == NULL) {
                  return false;
                }
                memset(t_ans, 0, sizeof(*t_ans) * (first_skip + limit)) ;
                cur_len = first_skip + limit;
            }
            if (dtr + t_limit > cur_len){
                uint32_t * append_ans = (uint32_t *)malloc(sizeof(*append_ans) * (cur_len + t_limit));
                if(append_ans == NULL) {
                  if(t_ans != NULL) free(t_ans);
                  return false;
                }
                memset(append_ans, 0, sizeof(*append_ans) * (cur_len + t_limit));
                cur_len = cur_len + t_limit;
                memcpy(append_ans, t_ans, dtr * sizeof(uint32_t));
                free(t_ans);
                t_ans = append_ans;
            }
            switch (ra->typecodes[i]) {
                case BITSET_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_bitset(c),  ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
                case ARRAY_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_array(c), ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
                case RUN_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_run(c), ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
            }
            dtr += t_limit;
        }
        ctr += t_limit;
        if (dtr-first_skip >= limit) break;
    }
    if(t_ans != NULL) {
      memcpy(ans, t_ans+first_skip, limit * sizeof(uint32_t));
      free(t_ans);
    }
    return true;
}